

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O0

int do_bind(char *host,int port,int protocol,int *family)

{
  int iVar1;
  int iVar2;
  char local_88 [8];
  char portstr [16];
  addrinfo *local_70;
  addrinfo *ai_list;
  addrinfo ai_hints;
  int reuse;
  int status;
  int fd;
  int *family_local;
  int protocol_local;
  int port_local;
  char *host_local;
  
  ai_hints.ai_next._4_4_ = 1;
  local_70 = (addrinfo *)0x0;
  if ((host == (char *)0x0) || (_protocol_local = host, *host == '\0')) {
    _protocol_local = "0.0.0.0";
  }
  sprintf(local_88,"%d",(ulong)(uint)port);
  memset(&ai_list,0,0x30);
  ai_list._4_4_ = 0;
  if (protocol == 6) {
    ai_hints.ai_flags = 1;
  }
  else {
    if (protocol != 0x11) {
      __assert_fail("protocol == IPPROTO_UDP",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/socket_server.c"
                    ,0x56d,"int do_bind(const char *, int, int, int *)");
    }
    ai_hints.ai_flags = 2;
  }
  ai_hints.ai_family = protocol;
  iVar1 = getaddrinfo(_protocol_local,local_88,(addrinfo *)&ai_list,&local_70);
  if (iVar1 == 0) {
    *family = local_70->ai_family;
    iVar1 = socket(*family,local_70->ai_socktype,0);
    if (-1 < iVar1) {
      iVar2 = setsockopt(iVar1,1,2,(void *)((long)&ai_hints.ai_next + 4),4);
      if ((iVar2 != -1) && (iVar2 = bind(iVar1,local_70->ai_addr,local_70->ai_addrlen), iVar2 == 0))
      {
        freeaddrinfo(local_70);
        return iVar1;
      }
      close(iVar1);
    }
    freeaddrinfo(local_70);
  }
  return -1;
}

Assistant:

static int
do_bind(const char *host, int port, int protocol, int *family) {
	int fd;
	int status;
	int reuse = 1;
	struct addrinfo ai_hints;
	struct addrinfo *ai_list = NULL;
	char portstr[16];
	if (host == NULL || host[0] == 0) {
		host = "0.0.0.0";	// INADDR_ANY
	}
	sprintf(portstr, "%d", port);
	memset( &ai_hints, 0, sizeof( ai_hints ) );
	ai_hints.ai_family = AF_UNSPEC;
	if (protocol == IPPROTO_TCP) {
		ai_hints.ai_socktype = SOCK_STREAM;
	} else {
		assert(protocol == IPPROTO_UDP);
		ai_hints.ai_socktype = SOCK_DGRAM;
	}
	ai_hints.ai_protocol = protocol;

	status = getaddrinfo( host, portstr, &ai_hints, &ai_list );
	if ( status != 0 ) {
		return -1;
	}
	*family = ai_list->ai_family;
	fd = socket(*family, ai_list->ai_socktype, 0);
	if (fd < 0) {
		goto _failed_fd;
	}
	if (setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, (void *)&reuse, sizeof(int))==-1) {
		goto _failed;
	}
	status = bind(fd, (struct sockaddr *)ai_list->ai_addr, ai_list->ai_addrlen);
	if (status != 0)
		goto _failed;

	freeaddrinfo( ai_list );
	return fd;
_failed:
	close(fd);
_failed_fd:
	freeaddrinfo( ai_list );
	return -1;
}